

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O0

void __thiscall
ktx::Reporter::
fatal<char_const(&)[74],std::__cxx11::string_const&,unsigned_int_const&,unsigned_int&,std::__cxx11::string>
          (Reporter *this,ReturnCode return_code,char (*args) [74],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,uint *args_2,
          uint *args_3,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4)

{
  format_string<const_std::__cxx11::basic_string<char>_&,_const_unsigned_int_&,_unsigned_int_&,_std::__cxx11::basic_string<char>_>
  fmt;
  uint *args_1_00;
  char *pcVar1;
  undefined8 uVar2;
  char *in_RCX;
  size_t in_RDX;
  ostream *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  undefined8 in_stack_00000008;
  ReturnCode returnCode;
  FatalError *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  char **ppcVar3;
  ostream *in_stack_ffffffffffffff10;
  basic_string_view<char> in_stack_ffffffffffffff18;
  char *local_d8 [3];
  size_t local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  pcVar1 = "{} fatal: ";
  args_1_00 = (uint *)std::char_traits<char>::length((char_type *)0x20359c);
  ::fmt::v10::print<std::__cxx11::string&>
            (in_stack_ffffffffffffff10,
             (format_string<std::__cxx11::basic_string<char>_&>)in_stack_ffffffffffffff18,
             in_stack_ffffffffffffff08);
  local_c0 = std::char_traits<char>::length((char_type *)0x20363a);
  fmt.str_.size_ = in_RDX;
  fmt.str_.data_ = in_RCX;
  returnCode = in_stack_00000008._4_4_;
  ::fmt::v10::
  print<std::__cxx11::string_const&,unsigned_int_const&,unsigned_int&,std::__cxx11::string>
            (in_R8,fmt,in_R9,args_1_00,(uint *)pcVar1,in_stack_ffffffffffffffd0);
  ppcVar3 = local_d8;
  local_d8[0] = "\n";
  pcVar1 = (char *)std::char_traits<char>::length((char_type *)0x2036f1);
  ppcVar3[1] = pcVar1;
  ::fmt::v10::print<>(in_stack_ffffffffffffff10,(format_string<>)in_stack_ffffffffffffff18);
  uVar2 = __cxa_allocate_exception(0x10);
  FatalError::FatalError(in_stack_fffffffffffffee0,returnCode);
  __cxa_throw(uVar2,&FatalError::typeinfo,FatalError::~FatalError);
}

Assistant:

void fatal(ReturnCode return_code, Args&&... args) {
        fmt::print(std::cerr, "{} fatal: ", commandName);
        fmt::print(std::cerr, std::forward<Args>(args)...);
        fmt::print(std::cerr, "\n");
        throw FatalError(return_code);
    }